

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O2

void __thiscall iDynTree::Visualizer::~Visualizer(Visualizer *this)

{
  VisualizerPimpl *this_00;
  
  this->_vptr_Visualizer = (_func_int **)&PTR__Visualizer_0010c730;
  this_00 = this->pimpl;
  if (this_00 != (VisualizerPimpl *)0x0) {
    VisualizerPimpl::~VisualizerPimpl(this_00);
  }
  operator_delete(this_00,0x1b8);
  this->pimpl = (VisualizerPimpl *)0x0;
  return;
}

Assistant:

Visualizer::~Visualizer()
{
    close();

    delete pimpl;
    pimpl = 0;
}